

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads_kernel_2.h
# Opt level: O3

void __thiscall dlib::signaler::signaler(signaler *this,mutex *assoc_mutex)

{
  int iVar1;
  error *this_00;
  string local_40;
  
  this->associated_mutex = &assoc_mutex->myMutex;
  this->m = assoc_mutex;
  iVar1 = pthread_cond_init((pthread_cond_t *)&this->cond,(pthread_condattr_t *)0x0);
  if (iVar1 == 0) {
    return;
  }
  this_00 = (error *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,
             "in function signaler::signaler() an error occurred making the signaler","");
  error::error(this_00,ECREATE_SIGNALER,&local_40);
  *(undefined ***)this_00 = &PTR__error_001fa880;
  __cxa_throw(this_00,&thread_error::typeinfo,error::~error);
}

Assistant:

signaler (
            const mutex& assoc_mutex
        ) :
            associated_mutex(&assoc_mutex.myMutex),
            m(assoc_mutex)
        { 
            if (pthread_cond_init(&cond,0))
            {
                throw dlib::thread_error(ECREATE_SIGNALER,
        "in function signaler::signaler() an error occurred making the signaler"
                );      
            }
        }